

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

size_t __thiscall
trieste::PassDef::apply_special<false,true,false>(PassDef *this,Node *root,Match *match)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  Node *node;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  shared_ptr<trieste::NodeDef> *psVar5;
  undefined8 *puVar6;
  char cVar7;
  _Base_ptr p_Var8;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var9;
  ptrdiff_t pVar10;
  long lVar11;
  long lVar12;
  _Base_ptr p_Var13;
  undefined8 *puVar14;
  iterator it;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start;
  Node root_1;
  size_t local_a0;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_98;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_88;
  iterator iStack_80;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_78;
  PassDef *local_68;
  NodeIt local_60;
  long local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *local_40;
  _Base_ptr local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar2 = *(ulong *)(local_50 + 0x10);
  if ((*(byte *)(uVar2 + 8) & 0x40) == 0) {
    p_Var13 = (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    if (p_Var13 == (_Base_ptr)0x0) {
      local_a0 = 0;
    }
    else {
      do {
        if (*(ulong *)(p_Var13 + 1) >= uVar2) {
          p_Var8 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar2];
      } while (p_Var13 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 == p_Var1) || (uVar2 < *(ulong *)(p_Var8 + 1))) {
        local_a0 = 0;
      }
      else {
        local_88 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                    *)local_50;
        iStack_80._M_current =
             (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
              *)local_48;
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_48->_M_use_count = local_48->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_48->_M_use_count = local_48->_M_use_count + 1;
          }
        }
        if (p_Var8[1]._M_right == (_Base_ptr)0x0) {
          std::__throw_bad_function_call();
        }
        local_a0 = (**(code **)(p_Var8 + 2))(&p_Var8[1]._M_parent);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_80._M_current !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_80._M_current);
        }
      }
    }
    local_88 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    iStack_80._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_78 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_98.second._M_current = *(shared_ptr<trieste::NodeDef> **)(local_50 + 0x58);
    local_98.first = (shared_ptr<trieste::NodeDef> *)&local_50;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_88,(iterator)0x0,&local_98);
    if (local_88 != iStack_80._M_current) {
      local_68 = this;
      local_38 = &p_Var1->_M_header;
      do {
        node = iStack_80._M_current[-1].first;
        p_Var3 = (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                 iStack_80._M_current[-1].second._M_current;
        peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (p_Var3 == (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                      (peVar4->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          lVar12 = *(long *)((long)(this->rule_map).map._M_elems +
                            (ulong)(((peVar4->type_).def)->default_map_id & 0xfffffff8));
          if ((*(char *)(lVar12 + 0x418) == '\0') &&
             (local_98.first =
                   (peVar4->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)local_98.first !=
             (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
             (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_58 = 0;
            do {
              puVar14 = *(undefined8 **)
                         (lVar12 + 0x18 +
                         (ulong)(*(uint *)(*(long *)(*(long *)local_98.first + 0x10) + 0xc) &
                                0xfffffff8));
              puVar6 = (undefined8 *)puVar14[1];
              local_60._M_current = local_98.first;
              for (puVar14 = (undefined8 *)*puVar14; puVar14 != puVar6; puVar14 = puVar14 + 0x14) {
                match->index = 0;
                ((match->captures).
                 super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first = false;
                local_98.first = local_60._M_current;
                cVar7 = (**(code **)(*(long *)*puVar14 + 0x20))
                                  ((long *)*puVar14,&local_98,node,match);
                if (cVar7 != '\0') {
                  local_40 = (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                             local_98.first;
                  _Var9 = std::
                          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                    (local_60._M_current);
                  if (((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)_Var9._M_current
                       == local_40) &&
                     (pVar10 = replace(local_68,match,(Effect<Node> *)(puVar14 + 0x10),&local_60,
                                       (NodeIt *)&local_98,node), pVar10 != -1)) {
                    local_58 = local_58 + pVar10;
                    if ((local_68->direction_ & 4) == 0) {
                      local_98.first =
                           (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->children).
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    }
                    else {
                      local_98.first =
                           (shared_ptr<trieste::NodeDef> *)((long)local_98.first + pVar10 * 0x10);
                    }
                    goto LAB_00175895;
                  }
                }
              }
              local_98.first = local_60._M_current + 1;
LAB_00175895:
              lVar11 = local_58;
            } while ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)local_98.first !=
                     (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                     (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->children).
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            lVar11 = 0;
          }
          local_a0 = local_a0 + lVar11;
          iStack_80._M_current = iStack_80._M_current + -1;
          this = local_68;
        }
        else {
          iStack_80._M_current[-1].second._M_current =
               (shared_ptr<trieste::NodeDef> *)(p_Var3 + 0x10);
          psVar5 = *(shared_ptr<trieste::NodeDef> **)&p_Var3->field_0x0;
          peVar4 = psVar5[1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if (((ulong)(peVar4->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                      super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi & 0x40) == 0) {
            p_Var13 = (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var8 = local_38;
            if (p_Var13 != (_Base_ptr)0x0) {
              do {
                if (*(element_type **)(p_Var13 + 1) >= peVar4) {
                  p_Var8 = p_Var13;
                }
                p_Var13 = (&p_Var13->_M_left)[*(element_type **)(p_Var13 + 1) < peVar4];
              } while (p_Var13 != (_Base_ptr)0x0);
              if ((p_Var8 != local_38) && (*(element_type **)(p_Var8 + 1) <= peVar4)) {
                local_98.second._M_current = *(shared_ptr<trieste::NodeDef> **)(p_Var3 + 8);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.second._M_current !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.second._M_current)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_98.second._M_current)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.second._M_current)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_98.second._M_current)->_M_use_count + 1;
                  }
                }
                local_98.first = psVar5;
                if (p_Var8[1]._M_right == (_Base_ptr)0x0) {
                  std::__throw_bad_function_call();
                }
                lVar12 = (**(code **)(p_Var8 + 2))(&p_Var8[1]._M_parent,&local_98);
                local_a0 = lVar12 + local_a0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.second._M_current !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_98.second._M_current);
                }
              }
            }
            local_98.second._M_current =
                 *(shared_ptr<trieste::NodeDef> **)(*(long *)&p_Var3->field_0x0 + 0x58);
            local_98.first = (shared_ptr<trieste::NodeDef> *)p_Var3;
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_88,iStack_80,&local_98);
            }
            else {
              (iStack_80._M_current)->first = (shared_ptr<trieste::NodeDef> *)p_Var3;
              ((iStack_80._M_current)->second)._M_current = local_98.second._M_current;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
      } while (local_88 != iStack_80._M_current);
    }
    if (local_88 !=
        (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  else {
    local_a0 = 0;
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return local_a0;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }